

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::mergeGlobalUniformBlocks
          (TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit,bool mergeExistingOnly)

{
  uint uVar1;
  pointer ppTVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  TIntermAggregate *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermSymbol *block;
  TIntermSymbol *unitBlock;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__lhs;
  undefined4 extraout_var_03;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__rhs;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TIntermNode *extraout_RDX;
  TIntermNode *extraout_RDX_00;
  TIntermNode *node;
  TIntermNode *extraout_RDX_01;
  pointer ppTVar7;
  bool bVar8;
  undefined8 *puVar9;
  TIntermSequence unitDefaultBlocks;
  TIntermSequence defaultBlocks;
  TVector<TIntermNode_*> local_70;
  anon_class_1_0_00000001 local_50 [8];
  undefined8 *local_48;
  undefined8 *local_40;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  undefined4 extraout_var_01;
  
  pTVar6 = findLinkerObjects(this);
  iVar5 = (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar6);
  this_00 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
            CONCAT44(extraout_var,iVar5);
  pTVar6 = findLinkerObjects(unit);
  iVar5 = (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar6);
  TVector<TIntermNode_*>::TVector((TVector<TIntermNode_*> *)local_50);
  TVector<TIntermNode_*>::TVector(&local_70);
  ppTVar2 = (this_00->super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  node = extraout_RDX;
  for (ppTVar7 = (this_00->
                 super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>)._M_impl
                 .super__Vector_impl_data._M_start; ppTVar7 != ppTVar2; ppTVar7 = ppTVar7 + 1) {
    mergeGlobalUniformBlocks::anon_class_1_0_00000001::operator()
              (local_50,(TIntermSequence *)*ppTVar7,node);
    node = extraout_RDX_00;
  }
  puVar3 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar5) + 0x10);
  for (puVar9 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar5) + 8); puVar9 != puVar3;
      puVar9 = puVar9 + 1) {
    mergeGlobalUniformBlocks::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&local_70,(TIntermSequence *)*puVar9,node);
    node = extraout_RDX_01;
  }
  ppTVar7 = local_70.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
            super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    puVar9 = local_48;
    bVar8 = !mergeExistingOnly;
    if (ppTVar7 ==
        local_70.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    for (; puVar9 != local_40; puVar9 = puVar9 + 1) {
      block = (TIntermSymbol *)(**(code **)(*(long *)*puVar9 + 0x60))();
      iVar5 = (*(*ppTVar7)->_vptr_TIntermNode[0xc])();
      unitBlock = (TIntermSymbol *)CONCAT44(extraout_var_01,iVar5);
      if ((block == (TIntermSymbol *)0x0) || (unitBlock == (TIntermSymbol *)0x0)) {
        __assert_fail("block && unitBlock",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                      ,0x2ae,
                      "void glslang::TIntermediate::mergeGlobalUniformBlocks(TInfoSink &, TIntermediate &, bool)"
                     );
      }
      iVar5 = (*(block->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(block);
      __lhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x28))
                        ((long *)CONCAT44(extraout_var_02,iVar5));
      iVar5 = (*(unitBlock->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                        (unitBlock);
      __rhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0x28))
                        ((long *)CONCAT44(extraout_var_03,iVar5));
      bVar4 = std::operator==(__lhs,__rhs);
      if (bVar4) {
        iVar5 = (*(block->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(block);
        uVar1 = *(uint *)(CONCAT44(extraout_var_04,iVar5) + 8);
        iVar5 = (*(unitBlock->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])
                          (unitBlock);
        if (((uVar1 ^ *(uint *)(CONCAT44(extraout_var_05,iVar5) + 8)) & 0x7f) == 0) {
          mergeBlockDefinitions(this,infoSink,block,unitBlock,unit);
          bVar8 = false;
        }
      }
    }
    if (bVar8) {
      std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                (this_00,ppTVar7);
    }
    ppTVar7 = ppTVar7 + 1;
  } while( true );
}

Assistant:

void TIntermediate::mergeGlobalUniformBlocks(TInfoSink& infoSink, TIntermediate& unit, bool mergeExistingOnly)
{
    TIntermSequence& linkerObjects = findLinkerObjects()->getSequence();
    TIntermSequence& unitLinkerObjects = unit.findLinkerObjects()->getSequence();

    // build lists of default blocks from the intermediates
    TIntermSequence defaultBlocks;
    TIntermSequence unitDefaultBlocks;

    auto filter = [](TIntermSequence& list, TIntermNode* node) {
        if (node->getAsSymbolNode()->getQualifier().defaultBlock) {
            list.push_back(node);
        }
    };

    std::for_each(linkerObjects.begin(), linkerObjects.end(),
        [&defaultBlocks, &filter](TIntermNode* node) {
            filter(defaultBlocks, node);
        });
    std::for_each(unitLinkerObjects.begin(), unitLinkerObjects.end(),
        [&unitDefaultBlocks, &filter](TIntermNode* node) {
            filter(unitDefaultBlocks, node);
    });

    auto itUnitBlock = unitDefaultBlocks.begin();
    for (; itUnitBlock != unitDefaultBlocks.end(); itUnitBlock++) {

        bool add = !mergeExistingOnly;
        auto itBlock = defaultBlocks.begin();

        for (; itBlock != defaultBlocks.end(); itBlock++) {
            TIntermSymbol* block = (*itBlock)->getAsSymbolNode();
            TIntermSymbol* unitBlock = (*itUnitBlock)->getAsSymbolNode();

            assert(block && unitBlock);

            // if the two default blocks match, then merge their definitions
            if (block->getType().getTypeName() == unitBlock->getType().getTypeName() &&
                block->getQualifier().storage == unitBlock->getQualifier().storage) {
                add = false;
                mergeBlockDefinitions(infoSink, block, unitBlock, &unit);
            }
        }
        if (add) {
            // push back on original list; won't change the size of the list we're iterating over
            linkerObjects.push_back(*itUnitBlock);
        }
    }
}